

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::submit::load(submit *this,context *context)

{
  uint *puVar1;
  request *prVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  const_iterator cVar3;
  form_type *pfVar4;
  key_type local_40;
  
  base_widget::pre_load
            ((base_widget *)
             ((long)&(this->super_base_html_input)._vptr_base_html_input +
             (long)(this->super_base_html_input)._vptr_base_html_input[-3]),context);
  puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                   (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
  *puVar1 = *puVar1 | 2;
  prVar2 = http::context::request(context);
  this_00 = &http::request::post_or_get_abi_cxx11_(prVar2)->_M_t;
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             ((this->super_base_html_input)._vptr_base_html_input[-3] + 0x18 +
             (long)&(this->super_base_html_input).type_._M_dataplus));
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(this_00,&local_40);
  prVar2 = http::context::request(context);
  pfVar4 = http::request::post_or_get_abi_cxx11_(prVar2);
  (this->super_base_html_input).field_0x38 =
       (_Rb_tree_header *)cVar3._M_node != &(pfVar4->_M_t)._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void submit::load(http::context &context)
{
	pre_load(context);
	set(true);
	pressed_ = context.request().post_or_get().find(name()) != context.request().post_or_get().end();
}